

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resbund.cpp
# Opt level: O1

void __thiscall icu_63::ResourceBundle::ResourceBundle(ResourceBundle *this,ResourceBundle *other)

{
  uint in_EAX;
  UResourceBundle *pUVar1;
  UErrorCode status;
  undefined8 uStack_18;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__ResourceBundle_003b9600;
  this->fLocale = (Locale *)0x0;
  uStack_18 = (ulong)in_EAX;
  if (other->fResource == (UResourceBundle *)0x0) {
    pUVar1 = (UResourceBundle *)0x0;
  }
  else {
    pUVar1 = ures_copyResb_63((UResourceBundle *)0x0,other->fResource,
                              (UErrorCode *)((long)&uStack_18 + 4));
  }
  this->fResource = pUVar1;
  return;
}

Assistant:

ResourceBundle::ResourceBundle(const ResourceBundle &other)
                              :UObject(other), fLocale(NULL)
{
    UErrorCode status = U_ZERO_ERROR;

    if (other.fResource) {
        fResource = ures_copyResb(0, other.fResource, &status);
    } else {
        /* Copying a bad resource bundle */
        fResource = NULL;
    }
}